

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O2

int main(int argc,char **argv)

{
  OutputFormats OVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  int iVar8;
  undefined4 uVar9;
  pointer ppcVar10;
  uint uVar11;
  char *pcVar12;
  ifstream *input_stream;
  bool bVar13;
  int vector_length;
  allocator local_739;
  char **local_738;
  int output_interval;
  OutputFormats local_728;
  uint local_724;
  double confidence_level;
  undefined8 local_718;
  pointer local_710;
  int num_data;
  vector<const_char_*,_std::allocator<const_char_*>_> statistics_file;
  vector<double,_std::allocator<double>_> first;
  double num_data_1;
  StatisticsAccumulation accumulation;
  vector<double,_std::allocator<double>_> tmp_1;
  ostringstream error_message_8;
  byte abStack_658 [488];
  int tmp;
  vector<double,_std::allocator<double>_> data;
  ifstream ifs;
  byte abStack_298 [488];
  Buffer buffer;
  
  vector_length = 1;
  output_interval = -1;
  confidence_level = 95.0;
  statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_718 = 0;
  local_728 = kMeanAndCovariance;
  iVar8 = 1;
  local_738 = argv;
  local_724 = argc;
  bVar3 = false;
switchD_00103704_caseD_65:
  bVar5 = bVar3;
  iVar6 = ya_getopt_long(local_724,local_738,"l:m:t:c:o:s:deh",(option *)0x0,(int *)0x0);
  bVar3 = true;
  switch(iVar6) {
  case 99:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
    bVar3 = sptk::ConvertStringToDouble((string *)&ifs,&confidence_level);
    if (!bVar3 || confidence_level <= 0.0) {
      std::__cxx11::string::~string((string *)&ifs);
    }
    else {
      local_710 = (pointer)confidence_level;
      std::__cxx11::string::~string((string *)&ifs);
      bVar3 = bVar5;
      if ((double)local_710 < 100.0) goto switchD_00103704_caseD_65;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -c option must be a number ");
    std::operator<<(poVar7,"in the open interval (0, 100)");
    std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
    break;
  case 100:
    local_718 = CONCAT71((int7)(CONCAT44(extraout_var,iVar6) >> 8),1);
    bVar3 = bVar5;
  case 0x65:
    goto switchD_00103704_caseD_65;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x72:
    goto switchD_00103704_caseD_66;
  case 0x68:
    iVar8 = 0;
    anon_unknown.dwarf_3816::PrintUsage((ostream *)&std::cout);
    goto LAB_00103bb5;
  case 0x6c:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
    bVar13 = 0 < vector_length;
    std::__cxx11::string::~string((string *)&ifs);
    bVar3 = bVar5;
    if (bVar2 && bVar13) goto switchD_00103704_caseD_65;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer");
    std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
    break;
  case 0x6d:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
    bVar13 = -1 < vector_length;
    std::__cxx11::string::~string((string *)&ifs);
    if (bVar3 && bVar13) {
      vector_length = vector_length + 1;
      bVar3 = bVar5;
      goto switchD_00103704_caseD_65;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
    std::operator<<(poVar7,"non-negative integer");
    std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
    break;
  case 0x6f:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&tmp);
    if (bVar3) {
      bVar3 = sptk::IsInRange(tmp,0,7);
      std::__cxx11::string::~string((string *)&ifs);
      if (bVar3) {
        local_728 = tmp;
        bVar3 = bVar5;
        goto switchD_00103704_caseD_65;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ifs);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ");
    poVar7 = std::operator<<(poVar7,"in the range of ");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
    poVar7 = std::operator<<(poVar7," to ");
    std::ostream::operator<<((ostream *)poVar7,7);
    std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
    break;
  case 0x73:
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&statistics_file,&ya_optarg)
    ;
    bVar3 = bVar5;
    goto switchD_00103704_caseD_65;
  case 0x74:
    goto switchD_00103704_caseD_74;
  default:
    if (iVar6 != -1) goto switchD_00103704_caseD_66;
    if ((output_interval == -1) ||
       (statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      if ((int)(local_724 - ya_optind) < 2) {
        if (local_724 == ya_optind) {
          pcVar12 = (char *)0x0;
        }
        else {
          pcVar12 = local_738[ya_optind];
        }
        bVar3 = sptk::SetBinaryMode();
        if (bVar3) {
          input_stream = &ifs;
          std::ifstream::ifstream(input_stream);
          OVar1 = local_728;
          if ((pcVar12 != (char *)0x0) &&
             (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar12),
             (abStack_298[*(long *)(_ifs + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
            poVar7 = std::operator<<((ostream *)&error_message_8,"Cannot open file ");
            std::operator<<(poVar7,pcVar12);
            std::__cxx11::string::string((string *)&tmp,"vstat",(allocator *)&buffer);
            sptk::PrintErrorMessage((string *)&tmp,&error_message_8);
            std::__cxx11::string::~string((string *)&tmp);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
            iVar8 = 1;
            goto LAB_0010449f;
          }
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            input_stream = (ifstream *)&std::cin;
          }
          uVar11 = 0;
          if (OVar1 < kNumOutputFormats) {
            if ((0x85U >> (OVar1 & 0x1f) & 1) == 0) {
              if ((0x48U >> (OVar1 & 0x1f) & 1) != 0) {
                uVar11 = 1;
              }
            }
            else {
              uVar11 = (uint)local_718;
            }
          }
          sptk::StatisticsAccumulation::StatisticsAccumulation
                    (&accumulation,vector_length + -1,(OVar1 != kMean) + 1,(bool)((byte)uVar11 & 1),
                     bVar5);
          sptk::StatisticsAccumulation::Buffer::Buffer(&buffer);
          if (accumulation.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
            std::operator<<((ostream *)&error_message_8,
                            "Failed to initialize StatisticsAccumulation");
            std::__cxx11::string::string((string *)&tmp,"vstat",(allocator *)&data);
            sptk::PrintErrorMessage((string *)&tmp,&error_message_8);
            std::__cxx11::string::~string((string *)&tmp);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
            local_738 = (char **)CONCAT44(local_738._4_4_,1);
            goto LAB_0010448d;
          }
          local_710 = statistics_file.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_738 = (char **)((ulong)local_738 & 0xffffffff00000000);
          ppcVar10 = statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_724 = uVar11;
          goto LAB_00103e44;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"Cannot specify -t option and -s option at the same time");
      std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
      sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
    }
  }
LAB_00103b9b:
  iVar8 = 1;
  std::__cxx11::string::~string((string *)&error_message_8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  goto LAB_00103bb5;
LAB_00104269:
  bVar5 = sptk::ReadStream<double>(false,0,0,vector_length,&data,(istream *)input_stream,(int *)0x0)
  ;
  if (!bVar5) goto LAB_001042e2;
  bVar5 = sptk::StatisticsAccumulation::Run(&accumulation,&data,&buffer);
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
    std::operator<<((ostream *)&error_message_8,"Failed to accumulate statistics");
    std::__cxx11::string::string((string *)&tmp,"vstat",(allocator *)&num_data);
    sptk::PrintErrorMessage((string *)&tmp,&error_message_8);
LAB_001043ed:
    std::__cxx11::string::~string((string *)&tmp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
    local_738 = (char **)CONCAT44(local_738._4_4_,1);
    goto LAB_00104480;
  }
  if ((output_interval != -1) && (iVar8 % output_interval == 0)) {
    bVar5 = anon_unknown.dwarf_3816::OutputStatistics
                      (&accumulation,&buffer,vector_length,local_728,confidence_level,bVar3);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
      std::operator<<((ostream *)&error_message_8,"Failed to write statistics");
      std::__cxx11::string::string((string *)&tmp,"vstat",(allocator *)&num_data);
      sptk::PrintErrorMessage((string *)&tmp,&error_message_8);
      goto LAB_001043ed;
    }
    sptk::StatisticsAccumulation::Clear(&accumulation,&buffer);
  }
  iVar8 = iVar8 + 1;
  goto LAB_00104269;
LAB_001042e2:
  bVar5 = sptk::StatisticsAccumulation::GetNumData(&accumulation,&buffer,&num_data);
  if (bVar5) {
    uVar9 = 0;
    if (((output_interval == -1) && (0 < num_data)) &&
       (bVar3 = anon_unknown.dwarf_3816::OutputStatistics
                          (&accumulation,&buffer,vector_length,local_728,confidence_level,bVar3),
       !bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
      std::operator<<((ostream *)&error_message_8,"Failed to write statistics");
      std::__cxx11::string::string((string *)&tmp,"vstat",(allocator *)&first);
      sptk::PrintErrorMessage((string *)&tmp,&error_message_8);
      goto LAB_0010445f;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
    std::operator<<((ostream *)&error_message_8,"Failed to accumulate statistics");
    std::__cxx11::string::string((string *)&tmp,"vstat",(allocator *)&first);
    sptk::PrintErrorMessage((string *)&tmp,&error_message_8);
LAB_0010445f:
    std::__cxx11::string::~string((string *)&tmp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
    uVar9 = 1;
  }
  local_738 = (char **)CONCAT44(local_738._4_4_,uVar9);
LAB_00104480:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  goto LAB_0010448d;
switchD_00103704_caseD_74:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
  bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&output_interval);
  bVar13 = 0 < output_interval;
  std::__cxx11::string::~string((string *)&ifs);
  bVar3 = bVar5;
  if (bVar2 && bVar13) goto switchD_00103704_caseD_65;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::operator<<((ostream *)&ifs,"The argument for the -t option must be a positive integer");
  std::__cxx11::string::string((string *)&error_message_8,"vstat",(allocator *)&tmp);
  sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
  goto LAB_00103b9b;
switchD_00103704_caseD_66:
  anon_unknown.dwarf_3816::PrintUsage((ostream *)&std::cerr);
  goto LAB_00103bb5;
LAB_00103e44:
  do {
    if (ppcVar10 == local_710) {
      std::vector<double,_std::allocator<double>_>::vector
                (&data,(long)vector_length,(allocator_type *)&error_message_8);
      iVar8 = 1;
      bVar3 = (bool)((byte)local_718 & 1);
      goto LAB_00104269;
    }
    pcVar12 = *ppcVar10;
    std::ifstream::ifstream((istream *)&error_message_8);
    std::ifstream::open((char *)&error_message_8,(_Ios_Openmode)pcVar12);
    if ((abStack_658[*(long *)(_error_message_8 + -0x18)] & 5) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&first,(long)vector_length,(allocator_type *)&tmp);
      std::vector<double,_std::allocator<double>_>::vector
                (&tmp_1,(long)vector_length,(allocator_type *)&tmp);
      sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&data,vector_length);
      do {
        bVar3 = sptk::ReadStream<double>(&num_data_1,(istream *)&error_message_8);
        if (!bVar3) goto LAB_00104167;
        bVar5 = sptk::ReadStream<double>
                          (false,0,0,vector_length,&first,(istream *)&error_message_8,(int *)0x0);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
          poVar7 = std::operator<<((ostream *)&tmp,"Failed to read statistics (first order) in ");
          std::operator<<(poVar7,pcVar12);
          std::__cxx11::string::string((string *)&num_data,"vstat",&local_739);
          sptk::PrintErrorMessage((string *)&num_data,(ostringstream *)&tmp);
          goto LAB_00104150;
        }
        if ((local_724 & 1) == 0) {
          bVar5 = sptk::ReadStream((SymmetricMatrix *)&data,(istream *)&error_message_8);
          if (!bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
            poVar7 = std::operator<<((ostream *)&tmp,"Failed to read statistics (second order) in ")
            ;
            poVar7 = std::operator<<(poVar7,pcVar12);
            std::operator<<(poVar7," (expected full matrix)");
            std::__cxx11::string::string((string *)&num_data,"vstat",&local_739);
            sptk::PrintErrorMessage((string *)&num_data,(ostringstream *)&tmp);
            goto LAB_00104150;
          }
        }
        else {
          bVar5 = sptk::ReadStream<double>
                            (false,0,0,vector_length,&tmp_1,(istream *)&error_message_8,(int *)0x0);
          if ((!bVar5) ||
             (bVar5 = sptk::SymmetricMatrix::SetDiagonal((SymmetricMatrix *)&data,&tmp_1), !bVar5))
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
            poVar7 = std::operator<<((ostream *)&tmp,"Failed to read statistics (second order) in ")
            ;
            poVar7 = std::operator<<(poVar7,pcVar12);
            std::operator<<(poVar7," (expected diagonal matrix)");
            std::__cxx11::string::string((string *)&num_data,"vstat",&local_739);
            sptk::PrintErrorMessage((string *)&num_data,(ostringstream *)&tmp);
            goto LAB_00104150;
          }
        }
        bVar5 = sptk::StatisticsAccumulation::Merge
                          (&accumulation,(int)num_data_1,&first,(SymmetricMatrix *)&data,&buffer);
      } while (bVar5);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      std::operator<<((ostream *)&tmp,"Failed to merge statistics");
      std::__cxx11::string::string((string *)&num_data,"vstat_merge",&local_739);
      sptk::PrintErrorMessage((string *)&num_data,(ostringstream *)&tmp);
LAB_00104150:
      std::__cxx11::string::~string((string *)&num_data);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      local_738 = (char **)CONCAT44(local_738._4_4_,1);
LAB_00104167:
      bVar3 = !bVar3;
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&data);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&tmp_1.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&first.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      poVar7 = std::operator<<((ostream *)&tmp,"Cannot open file ");
      std::operator<<(poVar7,pcVar12);
      std::__cxx11::string::string((string *)&data,"vstat",(allocator *)&num_data);
      sptk::PrintErrorMessage((string *)&data,(ostringstream *)&tmp);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      bVar3 = false;
      local_738 = (char **)CONCAT44(local_738._4_4_,1);
    }
    std::ifstream::~ifstream((istream *)&error_message_8);
    ppcVar10 = ppcVar10 + 1;
  } while (bVar3);
LAB_0010448d:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&buffer);
  iVar8 = (int)local_738;
LAB_0010449f:
  std::ifstream::~ifstream(&ifs);
LAB_00103bb5:
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&statistics_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return iVar8;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  double confidence_level(kDefaultConfidenceLevel);
  OutputFormats output_format(kDefaultOutputFormat);
  std::vector<const char*> statistics_file;
  bool outputs_only_diagonal_elements(kDefaultOutputOnlyDiagonalElementsFlag);
  bool numerically_stable(kDefaultNumericallyStableFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:t:c:o:s:deh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToDouble(optarg, &confidence_level) ||
            confidence_level <= 0.0 || 100.0 <= confidence_level) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a number "
                        << "in the open interval (0, 100)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 's': {
        statistics_file.push_back(optarg);
        break;
      }
      case 'd': {
        outputs_only_diagonal_elements = true;
        break;
      }
      case 'e': {
        numerically_stable = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEndOfFile != output_interval && !statistics_file.empty()) {
    std::ostringstream error_message;
    error_message << "Cannot specify -t option and -s option at the same time";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  bool diagonal(false);
  if (kMeanAndCovariance == output_format || kCovariance == output_format ||
      kSufficientStatistics == output_format) {
    if (outputs_only_diagonal_elements) {
      diagonal = true;
    }
  } else if (kStandardDeviation == output_format ||
             kMeanAndLowerAndUpperBounds == output_format) {
    diagonal = true;
  }

  sptk::StatisticsAccumulation accumulation(vector_length - 1,
                                            kMean == output_format ? 1 : 2,
                                            diagonal, numerically_stable);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  for (const char* file : statistics_file) {
    std::ifstream ifs2;
    ifs2.open(file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    double num_data;
    std::vector<double> first(vector_length);
    std::vector<double> tmp(vector_length);
    sptk::SymmetricMatrix second(vector_length);
    while (sptk::ReadStream(&num_data, &ifs2)) {
      if (!sptk::ReadStream(false, 0, 0, vector_length, &first, &ifs2, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to read statistics (first order) in " << file;
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }

      if (diagonal) {
        if (!sptk::ReadStream(false, 0, 0, vector_length, &tmp, &ifs2, NULL) ||
            !second.SetDiagonal(tmp)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected diagonal matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      } else {
        if (!sptk::ReadStream(&second, &ifs2)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected full matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      }

      if (!accumulation.Merge(static_cast<int>(num_data), first, second,
                              &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to merge statistics";
        sptk::PrintErrorMessage("vstat_merge", error_message);
        return 1;
      }
    }
  }

  std::vector<double> data(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                            confidence_level, outputs_only_diagonal_elements)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }
      accumulation.Clear(&buffer);
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                          confidence_level, outputs_only_diagonal_elements)) {
      std::ostringstream error_message;
      error_message << "Failed to write statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }

  return 0;
}